

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

bool scp::operator==(BigInt<unsigned_int,_unsigned_long> *x,int64_t y)

{
  int8_t iVar1;
  BigInt<unsigned_int,_unsigned_long> local_38;
  int64_t local_18;
  int64_t y_local;
  BigInt<unsigned_int,_unsigned_long> *x_local;
  
  local_18 = y;
  y_local = (int64_t)x;
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_38,y);
  iVar1 = BigInt<unsigned_int,_unsigned_long>::compare(x,&local_38);
  BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_38);
  return iVar1 == '\0';
}

Assistant:

constexpr bool operator==(const BigInt<TBase, TBuffer>& x, int64_t y)
	{
		return x.compare(y) == 0;
	}